

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  internalJSONNode *piVar1;
  allocator local_39;
  json_string local_38;
  JSONNode *local_18;
  JSONNode *other_local;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_18 = other;
  other_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (this->internal != local_18->internal) {
    operator=(local_18,this);
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode * other) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (internal == other -> internal) return;
	   *other = *this;
    }